

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O0

void __thiscall kj::std::anon_unknown_0::TestCase30::run(TestCase30 *this)

{
  int iVar1;
  uchar *puVar2;
  size_t __n;
  ArrayPtr<const_unsigned_char> AVar3;
  bool local_248;
  char local_247 [6];
  char local_241;
  bool _kj_shouldLog;
  char buf [7];
  void *local_238;
  void *local_230;
  void *local_228;
  void *local_220;
  undefined1 local_218 [8];
  ArrayPtr<const_unsigned_char> pieces [5];
  StdOutputStream out;
  undefined1 local_1a8 [8];
  StdInputStream in;
  stringstream ss;
  ostream local_188 [376];
  TestCase30 *local_10;
  TestCase30 *this_local;
  
  local_10 = this;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&in.stream_);
  StdInputStream::StdInputStream((StdInputStream *)local_1a8,(istream *)&in.stream_);
  StdOutputStream::StdOutputStream((StdOutputStream *)&pieces[4].size_,local_188);
  local_220 = (void *)0x0;
  puVar2 = implicitCast<unsigned_char_const*,decltype(nullptr)>(&local_220);
  AVar3 = arrayPtr<unsigned_char_const>(puVar2,0);
  pieces[0].ptr = (uchar *)AVar3.size_;
  local_218 = (undefined1  [8])AVar3.ptr;
  pieces._8_16_ = (undefined1  [16])arrayPtr<unsigned_char_const>("foo",3);
  local_228 = (void *)0x0;
  puVar2 = implicitCast<unsigned_char_const*,decltype(nullptr)>(&local_228);
  pieces._24_16_ = (undefined1  [16])arrayPtr<unsigned_char_const>(puVar2,0);
  pieces._40_16_ = (undefined1  [16])arrayPtr<unsigned_char_const>("bar",3);
  local_230 = (void *)0x0;
  puVar2 = implicitCast<unsigned_char_const*,decltype(nullptr)>(&local_230);
  pieces._56_16_ = (undefined1  [16])arrayPtr<unsigned_char_const>(puVar2,0);
  __n = pieces[4].ptr;
  ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>::ArrayPtr<5ul>
            ((ArrayPtr<kj::ArrayPtr<unsigned_char_const>const> *)&_kj_shouldLog,
             (ArrayPtr<const_unsigned_char> (*) [5])local_218);
  StdOutputStream::write((StdOutputStream *)&pieces[4].size_,__kj_shouldLog,local_238,__n);
  InputStream::read((InputStream *)local_1a8,(int)local_247,(void *)0x6,__n);
  local_241 = '\0';
  iVar1 = strcmp("foobar",local_247);
  if (iVar1 != 0) {
    local_248 = _::Debug::shouldLog(ERROR);
    while (local_248 != false) {
      _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[7]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
                 ,0x35,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
                 (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
                 (char (*) [7])"foobar",(char (*) [7])local_247);
      local_248 = false;
    }
  }
  StdOutputStream::~StdOutputStream((StdOutputStream *)&pieces[4].size_);
  StdInputStream::~StdInputStream((StdInputStream *)local_1a8);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&in.stream_);
  return;
}

Assistant:

TEST(StdIoStream, WriteVec) {
  // Check that writing an array of arrays works even when some of the arrays
  // are empty.  (This used to not work in some cases.)

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  ArrayPtr<const byte> pieces[5] = {
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("foo"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0),
    arrayPtr(reinterpret_cast<const byte*>("bar"), 3),
    arrayPtr(implicitCast<const byte*>(nullptr), 0)
  };

  out.write(pieces);

  char buf[7];
  in.read(buf, 6);
  buf[6] = '\0';

  EXPECT_STREQ("foobar", buf);
}